

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

XrResult ApiDumpLayerXrCreateVirtualKeyboardSpaceMETA
                   (XrSession session,XrVirtualKeyboardMETA keyboard,
                   XrVirtualKeyboardSpaceCreateInfoMETA *createInfo,XrSpace *keyboardSpace)

{
  undefined8 uVar1;
  bool bVar2;
  pointer ppVar3;
  ostream *poVar4;
  invalid_argument *this;
  mapped_type *ppXVar5;
  undefined1 local_5e0 [8];
  unique_lock<std::mutex> lock;
  _Node_iterator_base<std::pair<XrSpace_T_*const,_XrGeneratedDispatchTable_*>,_false> local_5c8;
  iterator exists;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8 [32];
  ostringstream local_588 [8];
  ostringstream oss_keyboardSpace;
  allocator local_409;
  string local_408 [39];
  allocator local_3e1;
  string local_3e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0 [32];
  ostringstream local_3a0 [8];
  ostringstream oss_keyboard;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228 [32];
  ostringstream local_208 [8];
  ostringstream oss_session;
  _Node_iterator_base<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>,_false> local_88;
  _Node_iterator_base<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>,_false> local_80;
  iterator map_iter;
  undefined1 local_68 [8];
  unique_lock<std::mutex> mlock;
  XrGeneratedDispatchTable *gen_dispatch_table;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  XrResult result;
  XrSpace *keyboardSpace_local;
  XrVirtualKeyboardSpaceCreateInfoMETA *createInfo_local;
  XrVirtualKeyboardMETA keyboard_local;
  XrSession session_local;
  
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  keyboard_local = (XrVirtualKeyboardMETA)session;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&gen_dispatch_table);
  mlock._M_owns = false;
  mlock._9_7_ = 0;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_68,&g_session_dispatch_mutex);
  local_80._M_cur =
       (__node_type *)
       std::
       unordered_map<XrSession_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrSession_T_*>,_std::equal_to<XrSession_T_*>,_std::allocator<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>_>_>
       ::find(&g_session_dispatch_map,(key_type *)&keyboard_local);
  local_88._M_cur =
       (__node_type *)
       std::
       unordered_map<XrSession_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrSession_T_*>,_std::equal_to<XrSession_T_*>,_std::allocator<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>_>_>
       ::end(&g_session_dispatch_map);
  bVar2 = std::__detail::operator==(&local_80,&local_88);
  if (bVar2) {
    session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>,_false,_false>
                           *)&local_80);
    mlock._8_8_ = ppVar3->second;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
  if (!bVar2) {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[33],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&gen_dispatch_table,(char (*) [9])"XrResult",
               (char (*) [33])"xrCreateVirtualKeyboardSpaceMETA",(char (*) [1])0x2ffb54);
    std::__cxx11::ostringstream::ostringstream(local_208);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_208,std::hex);
    std::ostream::operator<<(poVar4,keyboard_local);
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[10],char_const(&)[8],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&gen_dispatch_table,(char (*) [10])"XrSession",(char (*) [8])"session",local_228);
    std::__cxx11::string::~string((string *)local_228);
    std::__cxx11::ostringstream::ostringstream(local_3a0);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_3a0,std::hex);
    std::ostream::operator<<(poVar4,keyboard);
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[22],char_const(&)[9],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&gen_dispatch_table,(char (*) [22])"XrVirtualKeyboardMETA",
               (char (*) [9])"keyboard",local_3c0);
    std::__cxx11::string::~string((string *)local_3c0);
    uVar1 = mlock._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e0,"createInfo",&local_3e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_408,"const XrVirtualKeyboardSpaceCreateInfoMETA*",&local_409)
    ;
    bVar2 = ApiDumpOutputXrStruct
                      ((XrGeneratedDispatchTable *)uVar1,createInfo,(string *)local_3e0,
                       (string *)local_408,true,
                       (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&gen_dispatch_table);
    std::__cxx11::string::~string(local_408);
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
    std::__cxx11::string::~string(local_3e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Invalid Operation");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::ostringstream::ostringstream(local_588);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_588,std::hex);
    std::ostream::operator<<(poVar4,keyboardSpace);
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[14],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&gen_dispatch_table,(char (*) [9])0x300a36,(char (*) [14])"keyboardSpace",
               local_5a8);
    std::__cxx11::string::~string((string *)local_5a8);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&exists,
             (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gen_dispatch_table);
    ApiDumpLayerRecordContent
              ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&exists);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&exists);
    contents.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         (**(code **)(mlock._8_8_ + 0x708))(keyboard_local,keyboard,createInfo,keyboardSpace);
    if ((contents.
         super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS) &&
       (keyboardSpace != (XrSpace *)0x0)) {
      local_5c8._M_cur =
           (__node_type *)
           std::
           unordered_map<XrSpace_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrSpace_T_*>,_std::equal_to<XrSpace_T_*>,_std::allocator<std::pair<XrSpace_T_*const,_XrGeneratedDispatchTable_*>_>_>
           ::find(&g_space_dispatch_map,keyboardSpace);
      lock._8_8_ = std::
                   unordered_map<XrSpace_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrSpace_T_*>,_std::equal_to<XrSpace_T_*>,_std::allocator<std::pair<XrSpace_T_*const,_XrGeneratedDispatchTable_*>_>_>
                   ::end(&g_space_dispatch_map);
      bVar2 = std::__detail::operator==
                        (&local_5c8,
                         (_Node_iterator_base<std::pair<XrSpace_T_*const,_XrGeneratedDispatchTable_*>,_false>
                          *)&lock._M_owns);
      if (bVar2) {
        std::unique_lock<std::mutex>::unique_lock
                  ((unique_lock<std::mutex> *)local_5e0,&g_space_dispatch_mutex);
        uVar1 = mlock._8_8_;
        ppXVar5 = std::
                  unordered_map<XrSpace_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrSpace_T_*>,_std::equal_to<XrSpace_T_*>,_std::allocator<std::pair<XrSpace_T_*const,_XrGeneratedDispatchTable_*>_>_>
                  ::operator[](&g_space_dispatch_map,keyboardSpace);
        *ppXVar5 = (mapped_type)uVar1;
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_5e0);
      }
    }
    std::__cxx11::ostringstream::~ostringstream(local_588);
    std::__cxx11::ostringstream::~ostringstream(local_3a0);
    std::__cxx11::ostringstream::~ostringstream(local_208);
    bVar2 = false;
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&gen_dispatch_table);
  if (bVar2 == false) {
    session_local._4_4_ =
         contents.
         super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return session_local._4_4_;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrCreateVirtualKeyboardSpaceMETA(
    XrSession session,
    XrVirtualKeyboardMETA keyboard,
    const XrVirtualKeyboardSpaceCreateInfoMETA* createInfo,
    XrSpace* keyboardSpace) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_session_dispatch_mutex);
            auto map_iter = g_session_dispatch_map.find(session);
            if (map_iter == g_session_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrCreateVirtualKeyboardSpaceMETA", "");
        std::ostringstream oss_session;
        oss_session << std::hex << reinterpret_cast<const void*>(session);
        contents.emplace_back("XrSession", "session", oss_session.str());
        std::ostringstream oss_keyboard;
        oss_keyboard << std::hex << reinterpret_cast<const void*>(keyboard);
        contents.emplace_back("XrVirtualKeyboardMETA", "keyboard", oss_keyboard.str());
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, createInfo, "createInfo", "const XrVirtualKeyboardSpaceCreateInfoMETA*", true, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::ostringstream oss_keyboardSpace;
        oss_keyboardSpace << std::hex << reinterpret_cast<const void*>(keyboardSpace);
        contents.emplace_back("XrSpace*", "keyboardSpace", oss_keyboardSpace.str());
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->CreateVirtualKeyboardSpaceMETA(session, keyboard, createInfo, keyboardSpace);
        if (XR_SUCCESS == result && nullptr != keyboardSpace) {
            auto exists = g_space_dispatch_map.find(*keyboardSpace);
            if (exists == g_space_dispatch_map.end()) {
                std::unique_lock<std::mutex> lock(g_space_dispatch_mutex);
                g_space_dispatch_map[*keyboardSpace] = gen_dispatch_table;
            }
        }
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}